

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

int Gia_ObjFaninLit0p(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  
  iVar1 = Gia_ObjId(p,pObj);
  iVar1 = Abc_Var2Lit(iVar1 - (*(uint *)pObj & 0x1fffffff),*(uint *)pObj >> 0x1d & 1);
  return iVar1;
}

Assistant:

static inline int          Gia_ObjFaninLit0p( Gia_Man_t * p, Gia_Obj_t * pObj) { return Abc_Var2Lit( Gia_ObjFaninId0p(p, pObj), Gia_ObjFaninC0(pObj) );    }